

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::function_definition::~function_definition(function_definition *this)

{
  ~function_definition(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

explicit function_definition(const source_extend& extend, const source_extend& body_extend, const std::wstring& id, std::vector<std::wstring>&& params, statement_ptr&& block) : statement(extend), function_base(body_extend, id, std::move(params), std::move(block)) {
        assert(!this->id().empty());
    }